

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# invent.c
# Opt level: O3

obj * merge_choice(obj *objlist,obj *obj)

{
  uint uVar1;
  level *lev;
  char rmno;
  boolean bVar2;
  int iVar3;
  monst *mtmp;
  
  lev = level;
  if (obj->otyp == 0x155) {
LAB_001aef4c:
    objlist = (obj *)0x0;
  }
  else {
    uVar1 = *(uint *)&obj->field_0x4a;
    if ((invent == objlist) && (obj->where == '\x01')) {
      rmno = inside_shop(obj->olev,obj->ox,obj->oy);
      mtmp = shop_keeper(lev,rmno);
      if (mtmp != (monst *)0x0) {
        if ((*(uint *)&obj->field_0x4a & 8) == 0) {
          iVar3 = inhishop(mtmp);
          if (iVar3 != 0) goto LAB_001aef4c;
        }
        else {
          *(uint *)&obj->field_0x4a = *(uint *)&obj->field_0x4a & 0xfffffff7;
        }
      }
    }
    for (; objlist != (obj *)0x0; objlist = objlist->nobj) {
      bVar2 = mergable(objlist,obj);
      if (bVar2 != '\0') goto LAB_001aefd8;
    }
    objlist = (obj *)0x0;
LAB_001aefd8:
    *(uint *)&obj->field_0x4a = *(uint *)&obj->field_0x4a & 0xfffffff7 | uVar1 & 8;
  }
  return objlist;
}

Assistant:

struct obj *merge_choice(struct obj *objlist, struct obj *obj)
{
	struct monst *shkp;
	int save_nocharge;

	if (obj->otyp == SCR_SCARE_MONSTER)	/* punt on these */
	    return NULL;
	/* if this is an item on the shop floor, the attributes it will
	   have when carried are different from what they are now; prevent
	   that from eliciting an incorrect result from mergable() */
	save_nocharge = obj->no_charge;
	if (objlist == invent && obj->where == OBJ_FLOOR &&
		(shkp = shop_keeper(level, inside_shop(obj->olev, obj->ox, obj->oy))) != 0) {
	    if (obj->no_charge) obj->no_charge = 0;
	    /* A billable object won't have its `unpaid' bit set, so would
	       erroneously seem to be a candidate to merge with a similar
	       ordinary object.  That's no good, because once it's really
	       picked up, it won't merge after all.  It might merge with
	       another unpaid object, but we can't check that here (depends
	       too much upon shk's bill) and if it doesn't merge it would
	       end up in the '#' overflow inventory slot, so reject it now. */
	    else if (inhishop(shkp)) return NULL;
	}
	while (objlist) {
	    if (mergable(objlist, obj)) break;
	    objlist = objlist->nobj;
	}
	obj->no_charge = save_nocharge;
	return objlist;
}